

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O2

void __thiscall
TPZMeshSolution::Execute
          (TPZMeshSolution *this,TPZVec<double> *x,TPZVec<double> *f,TPZFMatrix<double> *df)

{
  TPZManVector<double,_3> *qsi;
  double dVar1;
  TPZCompEl *pTVar2;
  TPZGeoEl *pTVar3;
  double *pdVar4;
  int d;
  ulong uVar5;
  ulong uVar6;
  long col;
  ulong uVar7;
  TPZManVector<double,_3> xcopy;
  TPZManVector<double,_10> dsol;
  TPZManVector<double,_10> sol;
  
  TPZManVector<double,_3>::TPZManVector(&xcopy,x);
  qsi = &this->fLastLoc;
  TPZGeoMesh::FindElement
            (this->fMesh->fReference,&xcopy.super_TPZVec<double>,&qsi->super_TPZVec<double>,
             &this->fGeoElIndex,this->fDimension);
  pTVar3 = TPZGeoMesh::Element(this->fMesh->fReference,this->fGeoElIndex);
  pTVar2 = pTVar3->fReference;
  TPZManVector<double,_10>::TPZManVector(&sol,1);
  TPZManVector<double,_10>::TPZManVector(&dsol,3);
  (**(code **)(*(long *)pTVar2 + 0x1b0))(pTVar2,qsi,this->fSolutionVarindex,&sol);
  (**(code **)(*(long *)pTVar2 + 0x1b0))(pTVar2,qsi,this->fGradVarindex,&dsol);
  uVar6 = (df->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  uVar5 = 3;
  if ((long)uVar6 < 3) {
    uVar5 = uVar6;
  }
  uVar7 = 0;
  uVar6 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  for (col = 0; col < this->fNumSolutions; col = col + 1) {
    f->fStore[col] = sol.super_TPZVec<double>.fStore[col];
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = *(double *)((long)dsol.super_TPZVec<double>.fStore + uVar5 * 8 + uVar7);
      pdVar4 = TPZFMatrix<double>::operator()(df,uVar5,col);
      *pdVar4 = dVar1;
    }
    uVar7 = uVar7 + 0x18;
  }
  TPZManVector<double,_10>::~TPZManVector(&dsol);
  TPZManVector<double,_10>::~TPZManVector(&sol);
  TPZManVector<double,_3>::~TPZManVector(&xcopy);
  return;
}

Assistant:

void TPZMeshSolution::Execute(const TPZVec<REAL> &x, TPZVec<STATE> &f, TPZFMatrix<STATE> &df)
{
    TPZManVector<REAL,3> xcopy(x);
    fMesh->Reference()->FindElement(xcopy, fLastLoc, fGeoElIndex, fDimension);
    TPZGeoEl *gel = fMesh->Reference()->Element(fGeoElIndex);
    TPZCompEl *cel = gel->Reference();
    TPZManVector<STATE> sol(1), dsol(3);
    cel->Solution(fLastLoc,fSolutionVarindex,sol);
    cel->Solution(fLastLoc,fGradVarindex,dsol);
    int maxd = 3;
    if (df.Rows() < 3) {
        maxd = df.Rows();
    }
    for (int is=0; is<fNumSolutions; is++) {
        f[is] = sol[is];
        for (int d=0; d<maxd; d++) {
            df(d,is) = dsol[is*3+d];
        }
    }
}